

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_write.cpp
# Opt level: O1

bool check_string(string *stra)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = stra->_M_string_length;
  bVar5 = uVar1 != 0;
  if ((bVar5) && (pcVar2 = (stra->_M_dataplus)._M_p, *pcVar2 == ' ')) {
    uVar3 = 1;
    do {
      uVar4 = uVar3;
      if (uVar1 == uVar4) break;
      uVar3 = uVar4 + 1;
    } while (pcVar2[uVar4] == ' ');
    bVar5 = uVar4 < uVar1;
  }
  return bVar5;
}

Assistant:

bool check_string(string stra)
{
	for (int i = 0; i < stra.length(); i++)
	{
		if (stra.at(i) != ' ')
		{
			return true;
		}
	}
	return false;
}